

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O3

bool __thiscall
chrono::geometry::ChTriangleMeshConnected::ComputeWingedEdges
          (ChTriangleMeshConnected *this,
          map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          *winged_edges,bool allow_single_wing)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  pointer pCVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_> _Var9;
  _Base_ptr p_Var10;
  uint uVar11;
  ulong uVar12;
  _Rb_tree_color _Var13;
  undefined7 in_register_00000011;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>_>
  pVar19;
  multimap<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  edge_map;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> local_88;
  undefined4 local_74;
  _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,std::pair<int,int>>,std::_Select1st<std::pair<std::pair<int,int>const,std::pair<int,int>>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>
  *local_70;
  ChTriangleMeshConnected *local_68;
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar7 = (this->m_face_v_indices).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_70 = (_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,std::pair<int,int>>,std::_Select1st<std::pair<std::pair<int,int>const,std::pair<int,int>>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>
              *)winged_edges;
  local_68 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->m_face_v_indices).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar7) {
    lVar17 = 8;
    uVar16 = 0;
    local_74 = (undefined4)CONCAT71(in_register_00000011,allow_single_wing);
    do {
      iVar1 = *(int *)((long)pCVar7->m_data + lVar17 + -8);
      iVar2 = *(int *)((long)pCVar7->m_data + lVar17 + -4);
      iVar3 = *(int *)((long)pCVar7->m_data + lVar17);
      iVar4 = iVar2;
      if (iVar1 < iVar2) {
        iVar4 = iVar1;
      }
      iVar14 = iVar2;
      if (iVar2 < iVar1) {
        iVar14 = iVar1;
      }
      iVar5 = iVar1;
      if (iVar3 < iVar1) {
        iVar5 = iVar3;
      }
      if (iVar1 < iVar3) {
        iVar1 = iVar3;
      }
      local_88.first.second = iVar14;
      local_88.first.first = iVar4;
      iVar14 = (int)uVar16;
      local_88.second.first = iVar14;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
      ::_M_insert_equal<std::pair<std::pair<int,int>const,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                  *)&local_60,(pair<const_std::pair<int,_int>,_int> *)&local_88);
      iVar4 = iVar3;
      if (iVar3 < iVar2) {
        iVar4 = iVar2;
      }
      if (iVar2 < iVar3) {
        iVar3 = iVar2;
      }
      local_88.first.second = iVar4;
      local_88.first.first = iVar3;
      local_88.second.first = iVar14;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
      ::_M_insert_equal<std::pair<std::pair<int,int>const,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                  *)&local_60,(pair<const_std::pair<int,_int>,_int> *)&local_88);
      local_88.first.second = iVar1;
      local_88.first.first = iVar5;
      local_88.second.first = iVar14;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
      ::_M_insert_equal<std::pair<std::pair<int,int>const,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                  *)&local_60,(pair<const_std::pair<int,_int>,_int> *)&local_88);
      uVar6 = local_74;
      uVar16 = uVar16 + 1;
      lVar17 = lVar17 + 0xc;
      pCVar7 = (local_68->m_face_v_indices).
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar12 = ((long)(local_68->m_face_v_indices).
                      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 2) *
               -0x5555555555555555;
    } while (uVar16 <= uVar12 && uVar12 - uVar16 != 0);
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        pVar19 = std::
                 _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                 ::equal_range(&local_60,(key_type *)(p_Var10 + 1));
        _Var9 = pVar19.first._M_node;
        if (_Var9._M_node != pVar19.second._M_node._M_node) {
          uVar15 = *(uint *)&_Var9._M_node[1]._M_parent;
          if (uVar15 == 0xffffffff) {
            uVar11 = 0xffffffff;
            uVar16 = 0;
            _Var13 = _S_red;
          }
          else {
            bVar18 = false;
            uVar11 = uVar15;
            do {
              p_Var8 = _Var9._M_node;
              if (bVar18) {
                _Var13 = p_Var8[1]._M_color;
                uVar16 = (ulong)*(uint *)&p_Var8[1].field_0x4;
                uVar12 = (ulong)uVar11 << 0x20;
                goto LAB_00809723;
              }
              _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
              if (_Var9._M_node == pVar19.second._M_node._M_node) break;
              uVar11 = *(uint *)&_Var9._M_node[1]._M_parent;
              bVar18 = true;
            } while (uVar11 != 0xffffffff);
            _Var13 = p_Var8[1]._M_color;
            uVar16 = (ulong)*(uint *)&p_Var8[1].field_0x4;
            uVar11 = uVar15;
          }
          bVar18 = uVar15 != 0xffffffff;
          uVar12 = 0xffffffff00000000;
          uVar15 = uVar11;
          if ((bVar18 & (byte)uVar6) != 0) {
LAB_00809723:
            local_88.first = (pair<int,_int>)((ulong)_Var13 | uVar16 << 0x20);
            local_88.second = (pair<int,_int>)(uVar15 | uVar12);
            std::
            _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,std::pair<int,int>>,std::_Select1st<std::pair<std::pair<int,int>const,std::pair<int,int>>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>
            ::_M_emplace_unique<std::pair<std::pair<int,int>,std::pair<int,int>>>
                      (local_70,&local_88);
            *(undefined4 *)&p_Var10[1]._M_parent = 0xffffffff;
          }
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != &local_60._M_impl.super__Rb_tree_header);
    }
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return false;
}

Assistant:

bool ChTriangleMeshConnected::ComputeWingedEdges(std::map<std::pair<int, int>, std::pair<int, int>>& winged_edges,
                                                 bool allow_single_wing) const {
    bool pathological_edges = false;

    std::multimap<std::pair<int, int>, int> edge_map;

    for (int it = 0; it < this->m_face_v_indices.size(); ++it) {
        // edges = pairs of vertexes indexes
        std::pair<int, int> medgeA(this->m_face_v_indices[it].x(), this->m_face_v_indices[it].y());
        std::pair<int, int> medgeB(this->m_face_v_indices[it].y(), this->m_face_v_indices[it].z());
        std::pair<int, int> medgeC(this->m_face_v_indices[it].z(), this->m_face_v_indices[it].x());
        // vertex indexes in edges: always in increasing order to avoid ambiguous duplicated edges
        if (medgeA.first > medgeA.second)
            medgeA = std::pair<int, int>(medgeA.second, medgeA.first);
        if (medgeB.first > medgeB.second)
            medgeB = std::pair<int, int>(medgeB.second, medgeB.first);
        if (medgeC.first > medgeC.second)
            medgeC = std::pair<int, int>(medgeC.second, medgeC.first);
        edge_map.insert({medgeA, it});
        edge_map.insert({medgeB, it});
        edge_map.insert({medgeC, it});
    }

    for (auto aedge = edge_map.begin(); aedge != edge_map.end(); ++aedge) {
        auto ret = edge_map.equal_range(aedge->first);
        int nt = 0;
        std::pair<int, int> wingedge;
        std::pair<int, int> wingtri;
        wingtri.first = -1;
        wingtri.second = -1;
        for (auto fedge = ret.first; fedge != ret.second; ++fedge) {
            if (fedge->second == -1)
                break;
            wingedge.first = fedge->first.first;
            wingedge.second = fedge->first.second;
            if (nt == 0)
                wingtri.first = fedge->second;
            if (nt == 1)
                wingtri.second = fedge->second;
            ++nt;
            if (nt == 2)
                break;
        }
        if ((nt == 2) || ((nt == 1) && allow_single_wing)) {
            winged_edges.insert(
                std::pair<std::pair<int, int>, std::pair<int, int>>(wingedge, wingtri));  // ok found winged edge!
            aedge->second = -1;  // deactivate this way otherwise found again by sister
        }
        if (nt == 3) {
            pathological_edges = true;
            // GetLog() << "Warning: winged edge between "<< wing[0] << " and " << wing[1]  << " shared with more than
            // two triangles.\n";
        }
    }
    return pathological_edges;
}